

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[16],char_const*,char[7],char_const*,char[15],char[12],unsigned_int,char[64]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [16],char **Args_1,
          char (*Args_2) [7],char **Args_3,char (*Args_4) [15],char (*Args_5) [12],uint *Args_6,
          char (*Args_7) [64])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[16],char_const*,char[7],char_const*,char[15],char[12],unsigned_int,char[64]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [16])this,(char **)Args,(char (*) [7])Args_1,(char **)Args_2,
             (char (*) [15])Args_3,(char (*) [12])Args_4,(uint *)Args_5,(char (*) [64])Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}